

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaTabBar::mousePressEvent(QMdiAreaTabBar *this,QMouseEvent *event)

{
  undefined4 uVar1;
  uint uVar2;
  int index;
  ulong uVar3;
  QWidget *this_00;
  ulong uVar4;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar6 [16];
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 4) {
    uVar1 = QEventPoint::position();
    auVar6._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar6._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar6 = minpd(_DAT_0066f5d0,auVar6);
    auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar6._8_8_);
    auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar6._0_8_);
    uVar2 = movmskpd(uVar1,auVar5);
    uVar4 = 0x8000000000000000;
    if ((uVar2 & 1) != 0) {
      uVar4 = (ulong)(uint)(int)auVar6._0_8_ << 0x20;
    }
    uVar3 = 0x80000000;
    if ((uVar2 & 2) != 0) {
      uVar3 = (ulong)(uint)(int)auVar6._8_8_;
    }
    local_20 = (QPoint)(uVar3 | uVar4);
    index = QTabBar::tabAt(&this->super_QTabBar,&local_20);
    this_00 = &subWindowFromIndex(this,index)->super_QWidget;
    if (this_00 == (QWidget *)0x0) {
      event[0xc] = (QMouseEvent)0x0;
    }
    else {
      QWidget::close(this_00,index);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QTabBar::mousePressEvent(&this->super_QTabBar,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaTabBar::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::MiddleButton) {
        QTabBar::mousePressEvent(event);
        return;
    }

    QMdiSubWindow *subWindow = subWindowFromIndex(tabAt(event->position().toPoint()));
    if (!subWindow) {
        event->ignore();
        return;
    }

    subWindow->close();
}